

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void MoveBeforeTable(TidyDocImpl *doc,Node *row,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  Node *pNVar3;
  
  pNVar1 = (doc->root).parent;
  pNVar3 = pNVar1;
  if (pNVar1 == (Node *)0x0) {
    row->parent = (Node *)0x0;
    row->prev = (Node *)0x0;
    row->next = (Node *)0x0;
    return;
  }
  while ((pNVar3->tag == (Dict *)0x0 || (pNVar3->tag->id != TidyTag_TABLE))) {
    ppNVar2 = &pNVar3->parent;
    pNVar3 = *ppNVar2;
    if (*ppNVar2 == (Node *)0x0) {
      prvTidyInsertNodeBeforeElement(pNVar1,row);
      return;
    }
  }
  pNVar1 = pNVar3->parent;
  row->parent = pNVar1;
  row->next = pNVar3;
  row->prev = pNVar3->prev;
  pNVar3->prev = row;
  if (row->prev != (Node *)0x0) {
    row->prev->next = row;
  }
  if ((pNVar1 != (Node *)0x0) && (pNVar1->content == pNVar3)) {
    pNVar1->content = row;
    return;
  }
  return;
}

Assistant:

static void MoveBeforeTable( TidyDocImpl* ARG_UNUSED(doc), Node *row,
                            Node *node )
{
    Node *table;

    /* first find the table element */
    for (table = row->parent; table; table = table->parent)
    {
        if ( nodeIsTABLE(table) )
        {
            TY_(InsertNodeBeforeElement)( table, node );
            return;
        }
    }
    /* No table element */
    TY_(InsertNodeBeforeElement)( row->parent, node );
}